

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

__pid_t __thiscall Process::wait(Process *this,void *__stat_loc)

{
  code *pcVar1;
  int iVar2;
  __pid_t _Var3;
  int local_bc;
  pid_t pid_2;
  int status_1;
  Process **end;
  pid_t pid_1;
  pid_t ret;
  siginfo_t sigInfo;
  pid_t pid;
  int status;
  usize count_local;
  Process **processes_local;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&ProcessFramework::mutex);
  if ((iVar2 != 0) &&
     (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x4ee,"pthread_mutex_lock(&ProcessFramework::mutex) == 0"), iVar2 != 0)
     ) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if (ProcessFramework::signaled == -1) {
    ProcessFramework::signaled = 0;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
    if ((iVar2 != 0) &&
       (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                              ,0x507,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0"),
       iVar2 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else if (ProcessFramework::signaled == 0) {
    if (__stat_loc == (void *)0x0) {
      ProcessFramework::waitState = 1;
      do {
        iVar2 = pthread_cond_wait((pthread_cond_t *)&ProcessFramework::condition,
                                  (pthread_mutex_t *)&ProcessFramework::mutex);
        if ((iVar2 != 0) &&
           (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                  ,0x4f7,
                                  "pthread_cond_wait(&ProcessFramework::condition, &ProcessFramework::mutex) == 0"
                                 ), iVar2 != 0)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      } while (ProcessFramework::signaled == 0);
      if ((-1 < ProcessFramework::signaled) &&
         (iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                ,0x4fa,"ProcessFramework::signaled < 0"), iVar2 != 0)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      ProcessFramework::signaled = 0;
      ProcessFramework::waitState = 0;
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
      if ((iVar2 != 0) &&
         (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                ,0x4fd,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0"),
         iVar2 != 0)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    else {
      ProcessFramework::waitState = 2;
      iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
      if ((iVar2 != 0) &&
         (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                ,0x514,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0"),
         iVar2 != 0)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      end._4_4_ = waitid(P_ALL,0,(siginfo_t *)&pid_1,0x1000004);
      if (end._4_4_ != -1) {
        end._0_4_ = sigInfo.si_code;
        _pid_2 = &this->fdStdOutRead + (long)__stat_loc * 2;
        for (count_local = (usize)this; count_local < _pid_2; count_local = count_local + 8) {
          if (sigInfo.si_code == *(int *)(*(long *)count_local + 0xc)) {
            return (__pid_t)*(undefined8 *)count_local;
          }
        }
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&ProcessFramework::mutex);
        if ((iVar2 != 0) &&
           (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                  ,0x51d,"pthread_mutex_lock(&ProcessFramework::mutex) == 0"),
           iVar2 != 0)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        if (((int)end == ProcessFramework::signaled) &&
           (_Var3 = waitpid(ProcessFramework::signaled,&local_bc,0),
           _Var3 == ProcessFramework::signaled)) {
          ProcessFramework::signaled = 0;
        }
        ProcessFramework::waitState = 0;
        iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
        if ((iVar2 != 0) &&
           (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                  ,0x526,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0"),
           iVar2 != 0)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
    }
  }
  else {
    sigInfo._sifields._pad[0x1a] =
         waitpid(ProcessFramework::signaled,sigInfo._sifields._pad + 0x1b,0);
    if (sigInfo._sifields._pad[0x1a] == ProcessFramework::signaled) {
      ProcessFramework::signaled = 0;
    }
    ProcessFramework::waitState = 0;
    iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
    if ((iVar2 != 0) &&
       (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                              ,0x511,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0"),
       iVar2 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return 0;
}

Assistant:

Process* Process::wait(Process** processes, usize count)
{
#ifdef _WIN32
  EnterCriticalSection(&ProcessFramework::criticalSection);
  if(ProcessFramework::hInterruptEvent == INVALID_HANDLE_VALUE)
    ProcessFramework::hInterruptEvent = CreateEvent(NULL, FALSE, FALSE, NULL);
  LeaveCriticalSection(&ProcessFramework::criticalSection);
  HANDLE handles[MAXIMUM_WAIT_OBJECTS];
  Process* processMap[MAXIMUM_WAIT_OBJECTS];
  Process** p = processMap;
  handles[0] = ProcessFramework::hInterruptEvent;
  Process** pend = processes + count;
  HANDLE* hend = handles + MAXIMUM_WAIT_OBJECTS;
  HANDLE* h = handles + 1;
  for(; processes < pend; ++processes)
  {
    Process* process = *processes;
    if(process->hProcess == INVALID_HANDLE_VALUE)
      continue;
    *(h++) = process->hProcess;
    *(p++) = process;
    if(h >= hend)
      break;
  }
  DWORD dw = WaitForMultipleObjects((DWORD)(h - handles), handles, FALSE, INFINITE);
  ssize pIndex;
  if(dw <= WAIT_OBJECT_0 || (pIndex = dw - (WAIT_OBJECT_0 + 1)) >= p - processMap)
    return 0;
  return processMap[pIndex];
#else
  VERIFY(pthread_mutex_lock(&ProcessFramework::mutex) == 0);
  switch(ProcessFramework::signaled)
  {
  case 0:
    if(count == 0)
    {
      ProcessFramework::waitState = 1;
      for(;;)
      {
        VERIFY(pthread_cond_wait(&ProcessFramework::condition, &ProcessFramework::mutex) == 0);
        if(ProcessFramework::signaled)
        {
          ASSERT(ProcessFramework::signaled < 0);
          ProcessFramework::signaled = 0;
          ProcessFramework::waitState = 0;
          VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
          return 0;
        }
      }
    }
    else
      ProcessFramework::waitState = 2;
    break;
  case -1:
    ProcessFramework::signaled = 0;
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
    return 0;
  default:
    {
      int status;
      pid_t pid = waitpid(ProcessFramework::signaled, &status, 0);
      if(pid == ProcessFramework::signaled)
        ProcessFramework::signaled = 0;
      ProcessFramework::waitState = 0;
    }
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
    return 0;
  }
  VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
  siginfo_t sigInfo;
  pid_t ret = waitid(P_ALL, 0, &sigInfo, WEXITED | WNOWAIT);
  if(ret != -1)
  {
    pid_t pid = sigInfo.si_pid;
    for(Process** end = processes + count; processes < end; ++processes)
      if(pid == (pid_t)(*processes)->pid)
        return *processes;
    VERIFY(pthread_mutex_lock(&ProcessFramework::mutex) == 0);
    if(pid == ProcessFramework::signaled)
    {
        int status;
        pid_t pid = waitpid(ProcessFramework::signaled, &status, 0);
        if(pid == ProcessFramework::signaled)
          ProcessFramework::signaled = 0;
    }
    ProcessFramework::waitState = 0;
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
  }
  return 0;
#endif
}